

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O1

int ffgstr(fitsfile *fptr,char *string,char *card,int *status)

{
  uint uVar1;
  size_t sVar2;
  char *pcVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  int nextkey;
  int nkeys;
  undefined8 local_38;
  
  uVar1 = *status;
  local_38 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    return uVar1;
  }
  sVar2 = strlen(string);
  if ((int)sVar2 < 0x51) {
    ffghps(fptr,(int *)((long)&local_38 + 4),(int *)&local_38,status);
    iVar4 = (local_38._4_4_ - (int)local_38) + 1;
    iVar5 = 0;
    do {
      if (0 < iVar4) {
        do {
          ffgnky(fptr,card,status);
          pcVar3 = strstr(card,string);
          if (pcVar3 != (char *)0x0) {
            return *status;
          }
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
      }
      ffmaky(fptr,1,status);
      iVar4 = (int)local_38 + -1;
      bVar6 = iVar5 == 0;
      iVar5 = iVar5 + 1;
    } while (bVar6);
  }
  *status = 0xca;
  return 0xca;
}

Assistant:

int ffgstr( fitsfile *fptr,     /* I - FITS file pointer        */
            const char *string, /* I - string to match  */
            char *card,         /* O - keyword card             */
            int  *status)       /* IO - error status            */
/*
  Read (get) the next keyword record that contains the input character string,
  returning the entire keyword card up to 80 characters long.
  The returned card value is null terminated with any trailing blank 
  characters removed.
*/
{
    int nkeys, nextkey, ntodo, stringlen;
    int jj, kk;

    if (*status > 0)
        return(*status);

    stringlen = strlen(string);
    if (stringlen > 80) {
        return(*status = KEY_NO_EXIST);  /* matching string is too long to exist */
    }

    ffghps(fptr, &nkeys, &nextkey, status); /* get no. keywords and position */
    ntodo = nkeys - nextkey + 1;  /* first, read from next keyword to end */

    for (jj=0; jj < 2; jj++)
    {
      for (kk = 0; kk < ntodo; kk++)
      {
        ffgnky(fptr, card, status);     /* get next keyword */
        if (strstr(card, string) != 0) {
            return(*status);   /* found the matching string */
        }
      }

      ffmaky(fptr, 1, status);  /* reset pointer to beginning of header */
      ntodo = nextkey - 1;      /* number of keyword to read */ 
    }

    return(*status = KEY_NO_EXIST);  /* couldn't find the keyword */
}